

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O1

void __thiscall cmFindPackageCommand::AppendSearchPathGroups(cmFindPackageCommand *this)

{
  map<cmFindCommon::PathLabel,_cmSearchPath,_std::less<cmFindCommon::PathLabel>,_std::allocator<std::pair<const_cmFindCommon::PathLabel,_cmSearchPath>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  mapped_type *this_01;
  __normal_iterator<cmFindCommon::PathLabel_*,_std::vector<cmFindCommon::PathLabel,_std::allocator<cmFindCommon::PathLabel>_>_>
  _Var2;
  cmSearchPath cStack_88;
  pair<cmFindPackageCommand::PathLabel,_cmSearchPath> local_68;
  
  this_01 = std::
            map<cmFindCommon::PathGroup,_std::vector<cmFindCommon::PathLabel,_std::allocator<cmFindCommon::PathLabel>_>,_std::less<cmFindCommon::PathGroup>,_std::allocator<std::pair<const_cmFindCommon::PathGroup,_std::vector<cmFindCommon::PathLabel,_std::allocator<cmFindCommon::PathLabel>_>_>_>_>
            ::operator[](&(this->super_cmFindCommon).PathGroupLabelMap,&cmFindCommon::PathGroup::All
                        );
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<cmFindCommon::PathLabel*,std::vector<cmFindCommon::PathLabel,std::allocator<cmFindCommon::PathLabel>>>,__gnu_cxx::__ops::_Iter_equals_val<cmFindCommon::PathLabel_const>>
                    ((this_01->
                     super__Vector_base<cmFindCommon::PathLabel,_std::allocator<cmFindCommon::PathLabel>_>
                     )._M_impl.super__Vector_impl_data._M_start,
                     (this_01->
                     super__Vector_base<cmFindCommon::PathLabel,_std::allocator<cmFindCommon::PathLabel>_>
                     )._M_impl.super__Vector_impl_data._M_finish,
                     &cmFindCommon::PathLabel::CMakeSystem);
  std::vector<cmFindCommon::PathLabel,_std::allocator<cmFindCommon::PathLabel>_>::insert
            (this_01,(const_iterator)_Var2._M_current,&PathLabel::UserRegistry.super_PathLabel);
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<cmFindCommon::PathLabel*,std::vector<cmFindCommon::PathLabel,std::allocator<cmFindCommon::PathLabel>>>,__gnu_cxx::__ops::_Iter_equals_val<cmFindCommon::PathLabel_const>>
                    ((this_01->
                     super__Vector_base<cmFindCommon::PathLabel,_std::allocator<cmFindCommon::PathLabel>_>
                     )._M_impl.super__Vector_impl_data._M_start,
                     (this_01->
                     super__Vector_base<cmFindCommon::PathLabel,_std::allocator<cmFindCommon::PathLabel>_>
                     )._M_impl.super__Vector_impl_data._M_finish,
                     &cmFindCommon::PathLabel::CMakeSystem);
  std::vector<cmFindCommon::PathLabel,_std::allocator<cmFindCommon::PathLabel>_>::insert
            (this_01,(const_iterator)_Var2._M_current,&PathLabel::Builds.super_PathLabel);
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<cmFindCommon::PathLabel*,std::vector<cmFindCommon::PathLabel,std::allocator<cmFindCommon::PathLabel>>>,__gnu_cxx::__ops::_Iter_equals_val<cmFindCommon::PathLabel_const>>
                    ((this_01->
                     super__Vector_base<cmFindCommon::PathLabel,_std::allocator<cmFindCommon::PathLabel>_>
                     )._M_impl.super__Vector_impl_data._M_start,
                     (this_01->
                     super__Vector_base<cmFindCommon::PathLabel,_std::allocator<cmFindCommon::PathLabel>_>
                     )._M_impl.super__Vector_impl_data._M_finish,&cmFindCommon::PathLabel::Guess);
  std::vector<cmFindCommon::PathLabel,_std::allocator<cmFindCommon::PathLabel>_>::insert
            (this_01,(const_iterator)_Var2._M_current,&PathLabel::SystemRegistry.super_PathLabel);
  cmSearchPath::cmSearchPath(&cStack_88,&this->super_cmFindCommon);
  std::pair<cmFindPackageCommand::PathLabel,_cmSearchPath>::
  pair<cmFindPackageCommand::PathLabel_&,_cmSearchPath,_true>
            (&local_68,&PathLabel::UserRegistry,&cStack_88);
  this_00 = &(this->super_cmFindCommon).LabeledPaths;
  std::
  _Rb_tree<cmFindCommon::PathLabel,std::pair<cmFindCommon::PathLabel_const,cmSearchPath>,std::_Select1st<std::pair<cmFindCommon::PathLabel_const,cmSearchPath>>,std::less<cmFindCommon::PathLabel>,std::allocator<std::pair<cmFindCommon::PathLabel_const,cmSearchPath>>>
  ::_M_emplace_unique<std::pair<cmFindPackageCommand::PathLabel,cmSearchPath>>
            ((_Rb_tree<cmFindCommon::PathLabel,std::pair<cmFindCommon::PathLabel_const,cmSearchPath>,std::_Select1st<std::pair<cmFindCommon::PathLabel_const,cmSearchPath>>,std::less<cmFindCommon::PathLabel>,std::allocator<std::pair<cmFindCommon::PathLabel_const,cmSearchPath>>>
              *)this_00,&local_68);
  cmSearchPath::~cmSearchPath(&local_68.second);
  paVar1 = &local_68.first.super_PathLabel.super_cmPathLabel.Label.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first.super_PathLabel.super_cmPathLabel.Label._M_dataplus._M_p != paVar1) {
    operator_delete(local_68.first.super_PathLabel.super_cmPathLabel.Label._M_dataplus._M_p,
                    local_68.first.super_PathLabel.super_cmPathLabel.Label.field_2.
                    _M_allocated_capacity + 1);
  }
  cmSearchPath::~cmSearchPath(&cStack_88);
  cmSearchPath::cmSearchPath(&cStack_88,&this->super_cmFindCommon);
  std::pair<cmFindPackageCommand::PathLabel,_cmSearchPath>::
  pair<cmFindPackageCommand::PathLabel_&,_cmSearchPath,_true>
            (&local_68,&PathLabel::Builds,&cStack_88);
  std::
  _Rb_tree<cmFindCommon::PathLabel,std::pair<cmFindCommon::PathLabel_const,cmSearchPath>,std::_Select1st<std::pair<cmFindCommon::PathLabel_const,cmSearchPath>>,std::less<cmFindCommon::PathLabel>,std::allocator<std::pair<cmFindCommon::PathLabel_const,cmSearchPath>>>
  ::_M_emplace_unique<std::pair<cmFindPackageCommand::PathLabel,cmSearchPath>>
            ((_Rb_tree<cmFindCommon::PathLabel,std::pair<cmFindCommon::PathLabel_const,cmSearchPath>,std::_Select1st<std::pair<cmFindCommon::PathLabel_const,cmSearchPath>>,std::less<cmFindCommon::PathLabel>,std::allocator<std::pair<cmFindCommon::PathLabel_const,cmSearchPath>>>
              *)this_00,&local_68);
  cmSearchPath::~cmSearchPath(&local_68.second);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first.super_PathLabel.super_cmPathLabel.Label._M_dataplus._M_p != paVar1) {
    operator_delete(local_68.first.super_PathLabel.super_cmPathLabel.Label._M_dataplus._M_p,
                    local_68.first.super_PathLabel.super_cmPathLabel.Label.field_2.
                    _M_allocated_capacity + 1);
  }
  cmSearchPath::~cmSearchPath(&cStack_88);
  cmSearchPath::cmSearchPath(&cStack_88,&this->super_cmFindCommon);
  std::pair<cmFindPackageCommand::PathLabel,_cmSearchPath>::
  pair<cmFindPackageCommand::PathLabel_&,_cmSearchPath,_true>
            (&local_68,&PathLabel::SystemRegistry,&cStack_88);
  std::
  _Rb_tree<cmFindCommon::PathLabel,std::pair<cmFindCommon::PathLabel_const,cmSearchPath>,std::_Select1st<std::pair<cmFindCommon::PathLabel_const,cmSearchPath>>,std::less<cmFindCommon::PathLabel>,std::allocator<std::pair<cmFindCommon::PathLabel_const,cmSearchPath>>>
  ::_M_emplace_unique<std::pair<cmFindPackageCommand::PathLabel,cmSearchPath>>
            ((_Rb_tree<cmFindCommon::PathLabel,std::pair<cmFindCommon::PathLabel_const,cmSearchPath>,std::_Select1st<std::pair<cmFindCommon::PathLabel_const,cmSearchPath>>,std::less<cmFindCommon::PathLabel>,std::allocator<std::pair<cmFindCommon::PathLabel_const,cmSearchPath>>>
              *)this_00,&local_68);
  cmSearchPath::~cmSearchPath(&local_68.second);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first.super_PathLabel.super_cmPathLabel.Label._M_dataplus._M_p != paVar1) {
    operator_delete(local_68.first.super_PathLabel.super_cmPathLabel.Label._M_dataplus._M_p,
                    local_68.first.super_PathLabel.super_cmPathLabel.Label.field_2.
                    _M_allocated_capacity + 1);
  }
  cmSearchPath::~cmSearchPath(&cStack_88);
  return;
}

Assistant:

void cmFindPackageCommand::AppendSearchPathGroups()
{
  std::vector<cmFindCommon::PathLabel>* labels;

  // Update the All group with new paths
  labels = &this->PathGroupLabelMap[PathGroup::All];
  labels->insert(
    std::find(labels->begin(), labels->end(), PathLabel::CMakeSystem),
    PathLabel::UserRegistry);
  labels->insert(
    std::find(labels->begin(), labels->end(), PathLabel::CMakeSystem),
    PathLabel::Builds);
  labels->insert(std::find(labels->begin(), labels->end(), PathLabel::Guess),
                 PathLabel::SystemRegistry);

  // Create the new path objects
  this->LabeledPaths.insert(
    std::make_pair(PathLabel::UserRegistry, cmSearchPath(this)));
  this->LabeledPaths.insert(
    std::make_pair(PathLabel::Builds, cmSearchPath(this)));
  this->LabeledPaths.insert(
    std::make_pair(PathLabel::SystemRegistry, cmSearchPath(this)));
}